

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfSubscriber.c
# Opt level: O1

void messageCb(sbfSub sub,sbfBuffer_conflict buffer,void *closure)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  
  uVar3 = *buffer->mData;
  iVar2 = sbfMw_checkSupported(1);
  if (iVar2 == 1) {
    uVar1 = rdtsc();
    dVar4 = 0.0;
    if (uVar3 < uVar1) {
      dVar4 = (double)sbfPerfCounter_microseconds();
    }
    uVar3 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    gTimeTotal = gTimeTotal + uVar3;
    if (dVar4 < ((double)CONCAT44(0x45300000,(int)(gTimeLow >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)gTimeLow) - 4503599627370496.0)) {
      gTimeLow = uVar3;
    }
    if (((double)CONCAT44(0x45300000,(int)(gTimeHigh >> 0x20)) - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)gTimeHigh) - 4503599627370496.0) < dVar4) {
      gTimeHigh = uVar3;
    }
  }
  gMessages = gMessages + 1;
  return;
}

Assistant:

static void
messageCb (sbfSub sub, sbfBuffer buffer, void* closure)
{
    uint64_t* payload = sbfBuffer_getData (buffer);
    uint64_t  now;
    uint64_t  this = *payload;
    double    interval = 0;

    if(CAP_HI_RES_COUNTER == sbfMw_checkSupported(CAP_HI_RES_COUNTER))
    {
        now = sbfPerfCounter_get ();
        if (now > this)
            interval = sbfPerfCounter_microseconds (now - this);
        gTimeTotal += (uint64_t)interval;
        if (interval < gTimeLow)
            gTimeLow = (uint64_t)interval;
        if (interval > gTimeHigh)
            gTimeHigh = (uint64_t)interval;
    }

    gMessages++;
}